

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chebyshev-primality-test.cpp
# Opt level: O3

void BM_chebyshev(State *state)

{
  State SVar1;
  bool bVar2;
  int iVar3;
  mapped_type *pmVar4;
  ostream *poVar5;
  long lVar6;
  key_type local_50;
  
  lVar6 = *(long *)(state + 0x10);
  SVar1 = state[0x1a];
  benchmark::State::StartKeepRunning(state);
  if ((SVar1 == (State)0x0) && (lVar6 != 0)) {
    do {
      bVar2 = isprime_chebyshev(**(uint64_t **)(state + 0x20));
      iVar3 = gaIIsPrime(**(uint64_t **)(state + 0x20));
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"IS PRIME","");
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_benchmark::Counter,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_benchmark::Counter>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_benchmark::Counter,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_benchmark::Counter>_>_>
                             *)(state + 0x40),&local_50);
      pmVar4->value = (double)bVar2;
      pmVar4->flags = kDefaults;
      pmVar4->oneK = kIs1000;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if (bVar2 == (iVar3 == 0)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)std::cout,"Sanity check failed for ",0x18);
        poVar5 = std::ostream::_M_insert<long>((long)std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
        goto LAB_001191cd;
      }
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
  }
  benchmark::State::FinishKeepRunning(state);
LAB_001191cd:
  *(undefined8 *)(state + 0x38) = **(undefined8 **)(state + 0x20);
  return;
}

Assistant:

static void BM_chebyshev(benchmark::State& state) {

  for (auto _ : state) {
    bool prime = isprime_chebyshev(state.range(0));
    bool sanity_test = gaIIsPrime(state.range(0));
    state.counters["IS PRIME"] = prime; 
    if (sanity_test != prime) {
        std::cout << "Sanity check failed for " << state.range(0) << "\n";
        break;
    }
  }
  state.SetComplexityN(state.range(0));
}